

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_ARB_occlusion_query(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_ARB_occlusion_query != 0) {
    glad_glGenQueriesARB = (PFNGLGENQUERIESARBPROC)(*load)("glGenQueriesARB");
    glad_glDeleteQueriesARB = (PFNGLDELETEQUERIESARBPROC)(*load)("glDeleteQueriesARB");
    glad_glIsQueryARB = (PFNGLISQUERYARBPROC)(*load)("glIsQueryARB");
    glad_glBeginQueryARB = (PFNGLBEGINQUERYARBPROC)(*load)("glBeginQueryARB");
    glad_glEndQueryARB = (PFNGLENDQUERYARBPROC)(*load)("glEndQueryARB");
    glad_glGetQueryivARB = (PFNGLGETQUERYIVARBPROC)(*load)("glGetQueryivARB");
    glad_glGetQueryObjectivARB = (PFNGLGETQUERYOBJECTIVARBPROC)(*load)("glGetQueryObjectivARB");
    glad_glGetQueryObjectuivARB = (PFNGLGETQUERYOBJECTUIVARBPROC)(*load)("glGetQueryObjectuivARB");
  }
  return;
}

Assistant:

static void load_GL_ARB_occlusion_query(GLADloadproc load) {
	if(!GLAD_GL_ARB_occlusion_query) return;
	glad_glGenQueriesARB = (PFNGLGENQUERIESARBPROC)load("glGenQueriesARB");
	glad_glDeleteQueriesARB = (PFNGLDELETEQUERIESARBPROC)load("glDeleteQueriesARB");
	glad_glIsQueryARB = (PFNGLISQUERYARBPROC)load("glIsQueryARB");
	glad_glBeginQueryARB = (PFNGLBEGINQUERYARBPROC)load("glBeginQueryARB");
	glad_glEndQueryARB = (PFNGLENDQUERYARBPROC)load("glEndQueryARB");
	glad_glGetQueryivARB = (PFNGLGETQUERYIVARBPROC)load("glGetQueryivARB");
	glad_glGetQueryObjectivARB = (PFNGLGETQUERYOBJECTIVARBPROC)load("glGetQueryObjectivARB");
	glad_glGetQueryObjectuivARB = (PFNGLGETQUERYOBJECTUIVARBPROC)load("glGetQueryObjectuivARB");
}